

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_surjectionproof_parse
              (secp256k1_context *ctx,secp256k1_surjectionproof *proof,uchar *input,size_t inputlen)

{
  ulong uVar1;
  ushort uVar2;
  size_t sVar3;
  void *pvVar4;
  char *pcVar5;
  ulong count;
  
  if (proof == (secp256k1_surjectionproof *)0x0) {
    pvVar4 = (ctx->illegal_callback).data;
    pcVar5 = "proof != NULL";
  }
  else {
    if (input != (uchar *)0x0) {
      if (inputlen < 2) {
        return 0;
      }
      uVar2 = *(ushort *)input;
      if (0x100 < (ulong)uVar2) {
        return 0;
      }
      count = (ulong)(uVar2 + 7 >> 3);
      uVar1 = count + 2;
      if (inputlen < uVar1) {
        return 0;
      }
      if (((*input & 7) != 0) && (input[count + 1] >> (*input & 7) != 0)) {
        return 0;
      }
      sVar3 = secp256k1_count_bits_set(input + 2,count);
      if (sVar3 * 0x20 + uVar1 + 0x20 != inputlen) {
        return 0;
      }
      proof->n_inputs = (ulong)uVar2;
      memcpy(proof->used_inputs,input + 2,count);
      memcpy(proof->data,input + uVar1,sVar3 * 0x20 + 0x20);
      return 1;
    }
    pvVar4 = (ctx->illegal_callback).data;
    pcVar5 = "input != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar5,pvVar4);
  return 0;
}

Assistant:

int secp256k1_surjectionproof_parse(const secp256k1_context* ctx, secp256k1_surjectionproof *proof, const unsigned char *input, size_t inputlen) {
    size_t n_inputs;
    size_t signature_len;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(proof != NULL);
    ARG_CHECK(input != NULL);
    (void) ctx;

    if (inputlen < 2) {
        return 0;
    }
    n_inputs = ((size_t) (input[1] << 8)) + input[0];
    if (n_inputs > SECP256K1_SURJECTIONPROOF_MAX_N_INPUTS) {
        return 0;
    }
    if (inputlen < 2 + (n_inputs + 7) / 8) {
        return 0;
    }

    /* Check that the bitvector of used inputs is of the claimed
     * length; i.e. the final byte has no "padding bits" set */
    if (n_inputs % 8 != 0) {
        const unsigned char padding_mask = (~0U) << (n_inputs % 8);
        if ((input[2 + (n_inputs + 7) / 8 - 1] & padding_mask) != 0) {
            return 0;
        }
    }

    signature_len = 32 * (1 + secp256k1_count_bits_set(&input[2], (n_inputs + 7) / 8));
    if (inputlen != 2 + (n_inputs + 7) / 8 + signature_len) {
        return 0;
    }
    proof->n_inputs = n_inputs;
    memcpy(proof->used_inputs, &input[2], (n_inputs + 7) / 8);
    memcpy(proof->data, &input[2 + (n_inputs + 7) / 8], signature_len);

    return 1;
}